

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uct_node.cpp
# Opt level: O0

void __thiscall megumax::UCTNode::create_children(UCTNode *this,Position *pos,MoveList *move_list)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Move *__args;
  value_type *this_00;
  reference pdVar4;
  MoveList *in_RDX;
  long in_RDI;
  double __x;
  double *prob;
  iterator __end1_1;
  iterator __begin1_1;
  vector<double,_std::allocator<double>_> *__range1_1;
  double score;
  Move *move;
  const_iterator __end1;
  const_iterator __begin1;
  value_type *__range1;
  double sum;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  Position *in_stack_ffffffffffffff98;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffa0;
  double local_50;
  __normal_iterator<const_libchess::Move_*,_std::vector<libchess::Move,_std::allocator<libchess::Move>_>_>
  local_30;
  value_type *local_28;
  double local_20;
  MoveList *local_18;
  
  local_18 = in_RDX;
  iVar2 = libchess::MoveList::size((MoveList *)0x134be2);
  std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::reserve
            ((vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *)
             in_stack_ffffffffffffff90,CONCAT44(iVar2,in_stack_ffffffffffffff88));
  __args = (Move *)(in_RDI + 0x40);
  iVar3 = libchess::MoveList::size((MoveList *)0x134c16);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_ffffffffffffff90,CONCAT44(iVar2,in_stack_ffffffffffffff88));
  local_20 = 0.0;
  this_00 = libchess::MoveList::values(local_18);
  local_28 = this_00;
  local_30._M_current =
       (Move *)std::vector<libchess::Move,_std::allocator<libchess::Move>_>::begin
                         ((vector<libchess::Move,_std::allocator<libchess::Move>_> *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::vector<libchess::Move,_std::allocator<libchess::Move>_>::end
            ((vector<libchess::Move,_std::allocator<libchess::Move>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libchess::Move_*,_std::vector<libchess::Move,_std::allocator<libchess::Move>_>_>
                        *)this_00,
                       (__normal_iterator<const_libchess::Move_*,_std::vector<libchess::Move,_std::allocator<libchess::Move>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_libchess::Move_*,_std::vector<libchess::Move,_std::allocator<libchess::Move>_>_>
    ::operator*(&local_30);
    std::vector<megumax::UCTNode,std::allocator<megumax::UCTNode>>::
    emplace_back<libchess::Move_const&,megumax::UCTNode*>
              ((vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *)
               CONCAT44(iVar3,in_stack_ffffffffffffff70),__args,(UCTNode **)this_00);
    std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::back
              ((vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *)this_00);
    __x = p((UCTNode *)in_stack_ffffffffffffffa0._M_current,in_stack_ffffffffffffff98);
    if (__x < 30.0) {
      local_50 = exp(__x);
    }
    else {
      local_50 = 1.0;
    }
    local_20 = local_20 + local_50;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar3,in_stack_ffffffffffffff70),
               (value_type_conflict2 *)__args);
    __gnu_cxx::
    __normal_iterator<const_libchess::Move_*,_std::vector<libchess::Move,_std::allocator<libchess::Move>_>_>
    ::operator++(&local_30);
  }
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )this_00,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (!bVar1) break;
    pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&stack0xffffffffffffffa0);
    if ((local_20 != 0.0) || (NAN(local_20))) {
      *pdVar4 = *pdVar4 / local_20;
    }
    else {
      in_stack_ffffffffffffff5c = libchess::MoveList::size((MoveList *)0x134ddb);
      *pdVar4 = 1.0 / (double)in_stack_ffffffffffffff5c;
    }
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               &stack0xffffffffffffffa0);
  }
  return;
}

Assistant:

void UCTNode::create_children(libchess::Position& pos,
                              const libchess::MoveList& move_list) noexcept {
    children_.reserve(move_list.size());
    probabilities_.reserve(move_list.size());

    double sum = 0.0;
    for (const libchess::Move& move : move_list.values()) {
        assert(pos.is_legal_move(move));

        children_.emplace_back(move, this);

        double score = children_.back().p(pos);
        if (score >= 30) {
            score = 1.0;
        } else {
            score = std::exp(score);
        }
        assert(score >= 0.0);
        assert(!std::isnan(score));
        sum += score;

        probabilities_.push_back(score);
    }

    // Softmax
    for (auto& prob : probabilities_) {
        if (sum == 0.0) {
            prob = 1.0 / move_list.size();
        } else {
            prob = prob / sum;
        }
        assert(0.0 <= prob && prob <= 1.0);
    }

#ifndef NDEBUG
    double nsum = 0.0;
    for (auto& prob : probabilities_) {
        nsum += prob;
    }
    assert(std::abs(nsum - 1.0) <= 0.001);
#endif
}